

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDrawTests.cpp
# Opt level: O0

void deqp::gles2::Functional::anon_unknown_0::addTestIterations
               (DrawTest *test,DrawTestSpec *baseSpec,TestIterationType type)

{
  undefined1 local_70 [8];
  DrawTestSpec spec;
  TestIterationType type_local;
  DrawTestSpec *baseSpec_local;
  DrawTest *test_local;
  
  spec.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = type;
  deqp::gls::DrawTestSpec::DrawTestSpec((DrawTestSpec *)local_70,baseSpec);
  if (spec.attribs.
      super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == TYPE_DRAW_COUNT) {
    spec.apiType.m_bits = 1;
    deqp::gls::DrawTest::addIteration(test,(DrawTestSpec *)local_70,"draw count = 1");
    spec.apiType.m_bits = 5;
    deqp::gls::DrawTest::addIteration(test,(DrawTestSpec *)local_70,"draw count = 5");
    spec.apiType.m_bits = 0x19;
    deqp::gls::DrawTest::addIteration(test,(DrawTestSpec *)local_70,"draw count = 25");
  }
  deqp::gls::DrawTestSpec::~DrawTestSpec((DrawTestSpec *)local_70);
  return;
}

Assistant:

static void addTestIterations (gls::DrawTest* test, const gls::DrawTestSpec& baseSpec, TestIterationType type)
{
	gls::DrawTestSpec spec(baseSpec);

	if (type == TYPE_DRAW_COUNT)
	{
		spec.primitiveCount = 1;
		test->addIteration(spec, "draw count = 1");

		spec.primitiveCount = 5;
		test->addIteration(spec, "draw count = 5");

		spec.primitiveCount = 25;
		test->addIteration(spec, "draw count = 25");
	}
	else
		DE_ASSERT(false);
}